

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall
lsh::vector::vector(vector *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *cs,uint s)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  long lVar1;
  ulong uVar2;
  
  this_00 = &this->components_;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->size_ = s;
  uVar2 = (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,uVar2 & 0xffffffff);
  for (lVar1 = 0; (uVar2 & 0xffffffff) << 2 != lVar1; lVar1 = lVar1 + 4) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,(value_type_conflict2 *)
                       ((long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar1));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_shrink_to_fit(this_00);
  return;
}

Assistant:

vector::vector(const std::vector<unsigned int>& cs, unsigned int s) {
    this->size_ = s;

    unsigned int n = cs.size();

    this->components_.reserve(n);

    for (unsigned int i = 0; i < n; i++) {
      this->components_.push_back(cs[i]);
    }

    this->components_.shrink_to_fit();
  }